

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_rpm.c
# Opt level: O2

int rpm_bidder_init(archive_read_filter *self)

{
  int iVar1;
  void *pvVar2;
  
  self->code = 8;
  self->name = "rpm";
  pvVar2 = calloc(0x30,1);
  if (pvVar2 == (void *)0x0) {
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for rpm");
    iVar1 = -0x1e;
  }
  else {
    self->data = pvVar2;
    self->vtable = &rpm_reader_vtable;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
rpm_bidder_init(struct archive_read_filter *self)
{
	struct rpm   *rpm;

	self->code = ARCHIVE_FILTER_RPM;
	self->name = "rpm";

	rpm = (struct rpm *)calloc(sizeof(*rpm), 1);
	if (rpm == NULL) {
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for rpm");
		return (ARCHIVE_FATAL);
	}

	self->data = rpm;
	rpm->state = ST_LEAD;
	self->vtable = &rpm_reader_vtable;

	return (ARCHIVE_OK);
}